

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O2

void __thiscall
vkt::texture::util::TextureBinding::updateTextureData
          (TextureBinding *this,TestTextureSp *textureData,Type textureType)

{
  _func_int **pp_Var1;
  Allocation *pAVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  int iVar3;
  VkFormat value;
  uint uVar4;
  uint uVar5;
  VkResult VVar6;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstanceInterface *pIVar7;
  VkPhysicalDevice pVVar8;
  NotSupportedError *pNVar9;
  char *__rhs;
  VkImageType VVar10;
  bool bVar11;
  undefined1 in_stack_fffffffffffffed8 [12];
  deUint32 queueFamilyIndex;
  UVec3 textureDimension;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  VkImageFormatProperties imageFormatProperties;
  undefined1 local_88 [32];
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  deUint32 local_48;
  deUint32 *local_40;
  VkImageLayout local_38;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  queue = Context::getUniversalQueue(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  allocator = Context::getDefaultAllocator(this->m_context);
  this->m_type = textureType;
  de::SharedPtr<vkt::pipeline::TestTexture>::operator=(&this->m_textureData,textureData);
  bVar11 = this->m_type == TYPE_CUBE_MAP;
  VVar10 = (textureType == TYPE_3D) + VK_IMAGE_TYPE_2D;
  iVar3 = (*textureData->m_ptr->_vptr_TestTexture[5])();
  pp_Var1 = textureData->m_ptr->_vptr_TestTexture;
  if ((char)iVar3 == '\0') {
    iVar3 = (*pp_Var1[0xe])();
    value = ::vk::mapTextureFormat((TextureFormat *)CONCAT44(extraout_var_00,iVar3));
  }
  else {
    iVar3 = (*pp_Var1[9])(textureData->m_ptr,0,0);
    value = ::vk::mapCompressedTextureFormat(*(CompressedTexFormat *)CONCAT44(extraout_var,iVar3));
  }
  (*textureData->m_ptr->_vptr_TestTexture[0xf])(&textureDimension);
  uVar4 = (*textureData->m_ptr->_vptr_TestTexture[2])();
  uVar5 = (*textureData->m_ptr->_vptr_TestTexture[4])();
  pIVar7 = Context::getInstanceInterface(this->m_context);
  pVVar8 = Context::getPhysicalDevice(this->m_context);
  VVar6 = (*pIVar7->_vptr_InstanceInterface[4])
                    (pIVar7,pVVar8,(ulong)value,(ulong)VVar10,0,6,(ulong)bVar11 << 4,
                     &imageFormatProperties);
  if (VVar6 != VK_ERROR_FORMAT_NOT_SUPPORTED) {
    ::vk::checkResult(VVar6,"imageFormatQueryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                      ,0x149);
    if (imageFormatProperties.maxArrayLayers < uVar5) {
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar9,"Maximum array layers number for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x14c);
    }
    else if (imageFormatProperties.maxMipLevels < uVar4) {
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar9,"Maximum mimap level number for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x14f);
    }
    else {
      if (((textureDimension.m_data[0] <= imageFormatProperties.maxExtent.width) &&
          (textureDimension.m_data[1] <= imageFormatProperties.maxExtent.height)) &&
         (textureDimension.m_data[2] <= imageFormatProperties.maxExtent.depth)) {
        local_88._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        local_88._8_8_ = (void *)0x0;
        local_88._28_4_ = textureDimension.m_data[0];
        local_68 = textureDimension.m_data[1];
        local_64 = textureDimension.m_data[2];
        local_58._0_4_ = VK_SAMPLE_COUNT_1_BIT;
        local_58._4_4_ = VK_IMAGE_TILING_OPTIMAL;
        uStack_50._0_4_ = 6;
        uStack_50._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
        local_48 = 1;
        local_40 = &queueFamilyIndex;
        local_38 = VK_IMAGE_LAYOUT_UNDEFINED;
        local_88._16_4_ = (uint)bVar11 << 4;
        local_88._20_4_ = VVar10;
        local_88._24_4_ = value;
        local_60 = uVar4;
        local_5c = uVar5;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&local_e8,vk,device,
                          (VkImageCreateInfo *)local_88,(VkAllocationCallbacks *)0x0);
        local_c8.field_2._M_allocated_capacity = (size_type)local_e8.m_data.deleter.m_device;
        local_c8.field_2._8_8_ = local_e8.m_data.deleter.m_allocator;
        local_c8._M_dataplus._M_p = (pointer)local_e8.m_data.object.m_internal;
        local_c8._M_string_length = (size_type)local_e8.m_data.deleter.m_deviceIface;
        local_e8.m_data.object.m_internal = 0;
        local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
        local_e8.m_data.deleter.m_device = (VkDevice)0x0;
        local_e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::reset
                  (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
             = (VkDevice)local_c8.field_2._M_allocated_capacity;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)local_c8.field_2._8_8_;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
        m_internal = (deUint64)local_c8._M_dataplus._M_p;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)local_c8._M_string_length;
        ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_e8);
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&local_c8,vk,device,
                   (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal);
        (*allocator->_vptr_Allocator[3])(&local_e8,allocator,&local_c8,0);
        local_e8.m_data.object.m_internal = 0;
        data._12_4_ = uVar4;
        data._0_12_ = in_stack_fffffffffffffed8;
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
                  (&(this->m_textureImageMemory).
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,data);
        de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
                  ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_e8);
        pAVar2 = (this->m_textureImageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        VVar6 = (*vk->_vptr_DeviceInterface[0xd])
                          (vk,device,
                           (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,(pAVar2->m_memory).m_internal,pAVar2->m_offset);
        ::vk::checkResult(VVar6,
                          "vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                          ,0x172);
        updateTextureViewMipLevels(this,0,uVar4 - 1);
        vkt::pipeline::uploadTestTexture
                  (vk,device,queue,queueFamilyIndex,allocator,(this->m_textureData).m_ptr,
                   (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal);
        return;
      }
      pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar9,"Maximum image dimension for this format is not enough for this test.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                 ,0x155);
    }
    __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pNVar9 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Format not supported: ",(allocator<char> *)&local_e8);
  __rhs = ::vk::getFormatName(value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                 &local_c8,__rhs);
  tcu::NotSupportedError::NotSupportedError
            (pNVar9,(char *)CONCAT44(local_88._4_4_,local_88._0_4_),(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
             ,0x146);
  __cxa_throw(pNVar9,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBinding::updateTextureData (const TestTextureSp& textureData, const TextureBinding::Type textureType)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	m_type			= textureType;
	m_textureData	= textureData;

	const bool									isCube					= m_type == TYPE_CUBE_MAP;
	const VkImageCreateFlags					imageCreateFlags		= isCube ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0;
	const VkImageViewType						imageViewType			= textureTypeToImageViewType(textureType);
	const VkImageType							imageType				= imageViewTypeToImageType(imageViewType);
	const VkImageTiling							imageTiling				= VK_IMAGE_TILING_OPTIMAL;
	const VkImageUsageFlags						imageUsageFlags			= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	const VkFormat								format					= textureData->isCompressed() ? mapCompressedTextureFormat(textureData->getCompressedLevel(0, 0).getFormat()) : mapTextureFormat(textureData->getTextureFormat());
	const tcu::UVec3							textureDimension		= textureData->getTextureDimension();
	const deUint32								mipLevels				= textureData->getNumLevels();
	const deUint32								arraySize				= textureData->getArraySize();
	vk::VkImageFormatProperties					imageFormatProperties;
	const VkResult								imageFormatQueryResult	= m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(), format, imageType, imageTiling, imageUsageFlags, imageCreateFlags, &imageFormatProperties);

	if (imageFormatQueryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
	{
		TCU_THROW(NotSupportedError, (std::string("Format not supported: ") + vk::getFormatName(format)).c_str());
	}
	else
		VK_CHECK(imageFormatQueryResult);

	if (imageFormatProperties.maxArrayLayers < arraySize)
		TCU_THROW(NotSupportedError, ("Maximum array layers number for this format is not enough for this test."));

	if (imageFormatProperties.maxMipLevels < mipLevels)
		TCU_THROW(NotSupportedError, ("Maximum mimap level number for this format is not enough for this test."));

	if (imageFormatProperties.maxExtent.width < textureDimension.x() ||
		imageFormatProperties.maxExtent.height < textureDimension.y() ||
		imageFormatProperties.maxExtent.depth < textureDimension.z())
	{
		TCU_THROW(NotSupportedError, ("Maximum image dimension for this format is not enough for this test."));
	}

	// Create image
	const VkImageCreateInfo						imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			(deUint32)textureDimension.x(),
			(deUint32)textureDimension.y(),
			(deUint32)textureDimension.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arraySize,														// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,											// VkSampleCountFlagBits	samples;
		imageTiling,													// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	m_textureImage			= createImage(vkd, vkDevice, &imageParams);
	m_textureImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_textureImage), MemoryRequirement::Any);
	VK_CHECK(vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset()));

	updateTextureViewMipLevels(0, mipLevels - 1);

	pipeline::uploadTestTexture(vkd, vkDevice, queue, queueFamilyIndex, allocator, *m_textureData, *m_textureImage);
}